

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qislamiccivilcalendar.cpp
# Opt level: O1

QStringList * QIslamicCivilCalendar::nameList(void)

{
  qsizetype *pqVar1;
  Data *pDVar2;
  int *piVar3;
  QString *data;
  QString *pQVar4;
  ulong uVar5;
  QStringList *in_RDI;
  long lVar6;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_88;
  char16_t *local_80 [3];
  long local_68;
  char16_t *local_60;
  qsizetype local_58 [2];
  char16_t *local_48;
  undefined8 local_40;
  undefined8 local_38;
  char16_t *local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_80[0] = (char16_t *)0x0;
  local_80[1] = L"Islamic Civil";
  local_80[2] = (char16_t *)0xd;
  local_68 = 0;
  local_60 = L"islamic-civil";
  local_58[0] = 0xd;
  local_58[1] = 0;
  local_48 = L"islamicc";
  local_40 = 8;
  local_38 = 0;
  local_30 = L"Islamic";
  local_28 = 7;
  local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (QString *)QArrayData::allocate(&local_88,0x18,0x10,4,KeepSize);
  (in_RDI->d).d = (Data *)local_88;
  (in_RDI->d).ptr = pQVar4;
  (in_RDI->d).size = 0;
  uVar5 = 0xffffffffffffffe8;
  do {
    lVar6 = (in_RDI->d).size;
    pDVar2 = *(Data **)((long)local_80 + uVar5 + 0x18);
    pQVar4[lVar6].d.d = pDVar2;
    pQVar4[lVar6].d.ptr = *(char16_t **)((long)local_80 + uVar5 + 0x20);
    pQVar4[lVar6].d.size = *(qsizetype *)((long)local_58 + uVar5);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pqVar1 = &(in_RDI->d).size;
    *pqVar1 = *pqVar1 + 1;
    uVar5 = uVar5 + 0x18;
  } while (uVar5 < 0x48);
  lVar6 = 0x48;
  do {
    piVar3 = *(int **)((long)local_80 + lVar6);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)local_80 + lVar6),2,0x10);
      }
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QIslamicCivilCalendar::nameList()
{
    return {
        QStringLiteral("Islamic Civil"),
        QStringLiteral("islamic-civil"), // CLDR name
        QStringLiteral("islamicc"), // old CLDR name, still (2018) used by Mozilla
        // Until we have a concrete implementation that knows all the needed ephemerides:
        QStringLiteral("Islamic"),
    };
}